

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status parse_utf16_hex(char *s,uint *result)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  JSON_Status JVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  cVar1 = *s;
  iVar6 = (int)cVar1;
  JVar5 = -1;
  if (cVar1 != '\0') {
    cVar2 = s[1];
    iVar8 = (int)cVar2;
    if (cVar2 != '\0') {
      cVar3 = s[2];
      iVar11 = (int)cVar3;
      if (cVar3 != '\0') {
        cVar4 = s[3];
        iVar9 = (int)cVar4;
        if (cVar4 != '\0') {
          if ((byte)(cVar1 - 0x30U) < 10) {
            iVar7 = iVar6 + -0x30;
          }
          else if ((byte)(cVar1 + 0x9fU) < 6) {
            iVar7 = iVar6 + -0x57;
          }
          else {
            iVar7 = -1;
            if ((byte)(cVar1 + 0xbfU) < 6) {
              iVar7 = iVar6 + -0x37;
            }
          }
          if ((byte)(cVar2 - 0x30U) < 10) {
            iVar6 = iVar8 + -0x30;
          }
          else if ((byte)(cVar2 + 0x9fU) < 6) {
            iVar6 = iVar8 + -0x57;
          }
          else {
            iVar6 = -1;
            if ((byte)(cVar2 + 0xbfU) < 6) {
              iVar6 = iVar8 + -0x37;
            }
          }
          if ((byte)(cVar3 - 0x30U) < 10) {
            iVar8 = iVar11 + -0x30;
          }
          else if ((byte)(cVar3 + 0x9fU) < 6) {
            iVar8 = iVar11 + -0x57;
          }
          else {
            iVar8 = -1;
            if ((byte)(cVar3 + 0xbfU) < 6) {
              iVar8 = iVar11 + -0x37;
            }
          }
          if ((byte)(cVar4 - 0x30U) < 10) {
            uVar10 = iVar9 - 0x30;
          }
          else if ((byte)(cVar4 + 0x9fU) < 6) {
            uVar10 = iVar9 - 0x57;
          }
          else {
            uVar10 = 0xffffffff;
            if ((byte)(cVar4 + 0xbfU) < 6) {
              uVar10 = iVar9 - 0x37;
            }
          }
          if ((((iVar7 != -1) && (iVar6 != -1)) && (iVar8 != -1)) && (uVar10 != 0xffffffff)) {
            *result = iVar8 << 4 | uVar10 | iVar6 << 8 | iVar7 << 0xc;
            JVar5 = 0;
          }
        }
      }
    }
  }
  return JVar5;
}

Assistant:

static JSON_Status parse_utf16_hex(const char *s, unsigned int *result) {
    int x1, x2, x3, x4;
    if (s[0] == '\0' || s[1] == '\0' || s[2] == '\0' || s[3] == '\0') {
        return JSONFailure;
    }
    x1 = hex_char_to_int(s[0]);
    x2 = hex_char_to_int(s[1]);
    x3 = hex_char_to_int(s[2]);
    x4 = hex_char_to_int(s[3]);
    if (x1 == -1 || x2 == -1 || x3 == -1 || x4 == -1) {
        return JSONFailure;
    }
    *result = (unsigned int)((x1 << 12) | (x2 << 8) | (x3 << 4) | x4);
    return JSONSuccess;
}